

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 jsonHexToInt(int h)

{
  int h_local;
  
  return ((byte)(h >> 6) & 1) * '\t' + (char)h & 0xf;
}

Assistant:

static u8 jsonHexToInt(int h){
#ifdef SQLITE_ASCII
  h += 9*(1&(h>>6));
#endif
#ifdef SQLITE_EBCDIC
  h += 9*(1&~(h>>4));
#endif
  return (u8)(h & 0xf);
}